

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O1

void __thiscall ANN::set_batchSize(ANN *this,BatchSize batch_size)

{
  Shape SVar1;
  
  if (this->m_dataSet == (DataSet *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ERROR [set_batchsize()]: No available dataset!\n",0x2f);
  }
  SVar1 = DataSet::shape(this->m_dataSet);
  if (batch_size - Half < 2) {
    this->m_batchSize = SVar1.field_0._0_4_ >> ((byte)batch_size & 0x1f);
  }
  return;
}

Assistant:

void ANN::set_batchSize(BatchSize batch_size){
    if(!m_dataSet){
        std::cout<<"ERROR [set_batchsize()]: No available dataset!\n";
    }
    
    Shape shape=m_dataSet->shape();
    switch (batch_size)
    {
    case None:
        ;
        break;
    case Half:
        m_batchSize=shape.n_row/2;
        break;
    case Quarter:
        m_batchSize=shape.n_row/4;
        break;
    default: break;
    }
}